

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer-from-check.c
# Opt level: O1

void check_cb(uv_check_t *handle)

{
  int iVar1;
  uv_prepare_t *puVar2;
  
  iVar1 = uv_check_stop(&check_handle);
  if (iVar1 == 0) {
    iVar1 = uv_timer_stop(&timer_handle);
    if (iVar1 != 0) goto LAB_00176d46;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    if (iVar1 != 0) goto LAB_00176d4b;
    iVar1 = uv_prepare_start(&prepare_handle,prepare_cb);
    if (iVar1 != 0) goto LAB_00176d50;
    if (prepare_cb_called == '\x01') goto LAB_00176d55;
    if (check_cb_called == '\x01') goto LAB_00176d5a;
    if (timer_cb_called != '\x01') {
      check_cb_called = 1;
      return;
    }
  }
  else {
    check_cb_cold_1();
LAB_00176d46:
    check_cb_cold_2();
LAB_00176d4b:
    check_cb_cold_3();
LAB_00176d50:
    check_cb_cold_4();
LAB_00176d55:
    check_cb_cold_7();
LAB_00176d5a:
    check_cb_cold_6();
  }
  check_cb_cold_5();
  iVar1 = uv_timer_stop(&timer_handle);
  if (iVar1 == 0) {
    if (prepare_cb_called == '\0') goto LAB_00176d9e;
    if (check_cb_called == '\0') goto LAB_00176da3;
    if (timer_cb_called != '\x01') {
      timer_cb_called = 1;
      return;
    }
  }
  else {
    timer_cb_cold_1();
LAB_00176d9e:
    timer_cb_cold_2();
LAB_00176da3:
    timer_cb_cold_3();
  }
  timer_cb_cold_4();
  puVar2 = &prepare_handle;
  iVar1 = uv_prepare_stop(&prepare_handle);
  if (iVar1 == 0) {
    if (prepare_cb_called == '\x01') goto LAB_00176de7;
    if (check_cb_called != '\0') {
      if (timer_cb_called != '\x01') {
        prepare_cb_called = 1;
        return;
      }
      goto LAB_00176df1;
    }
  }
  else {
    prepare_cb_cold_1();
LAB_00176de7:
    prepare_cb_cold_4();
  }
  prepare_cb_cold_2();
LAB_00176df1:
  prepare_cb_cold_3();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar2,0);
  return;
}

Assistant:

static void check_cb(uv_check_t* handle) {
  ASSERT(0 == uv_check_stop(&check_handle));
  ASSERT(0 == uv_timer_stop(&timer_handle));  /* Runs before timer_cb. */
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 50, 0));
  ASSERT(0 == uv_prepare_start(&prepare_handle, prepare_cb));
  ASSERT(0 == prepare_cb_called);
  ASSERT(0 == check_cb_called);
  ASSERT(0 == timer_cb_called);
  check_cb_called++;
}